

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::DataSink::~DataSink(DataSink *this)

{
  long in_RDI;
  
  data_sink_streambuf::~data_sink_streambuf((data_sink_streambuf *)0x12c88f);
  std::ostream::~ostream((void *)(in_RDI + 0x60));
  std::function<bool_()>::~function((function<bool_()> *)0x12c8ab);
  std::function<void_()>::~function((function<void_()> *)0x12c8b9);
  std::function<bool_(const_char_*,_unsigned_long)>::~function
            ((function<bool_(const_char_*,_unsigned_long)> *)0x12c8c3);
  return;
}

Assistant:

DataSink() : os(&sb_), sb_(*this) {}